

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.h
# Opt level: O0

void __thiscall spvtools::opt::ConvertToHalfPass::ConvertToHalfPass(ConvertToHalfPass *this)

{
  ConvertToHalfPass *this_local;
  
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__ConvertToHalfPass_013bd078;
  std::
  unordered_set<spv::Op,_spvtools::opt::ConvertToHalfPass::hasher,_std::equal_to<spv::Op>,_std::allocator<spv::Op>_>
  ::unordered_set(&this->target_ops_core_);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->target_ops_450_);
  std::
  unordered_set<spv::Op,_spvtools::opt::ConvertToHalfPass::hasher,_std::equal_to<spv::Op>,_std::allocator<spv::Op>_>
  ::unordered_set(&this->image_ops_);
  std::
  unordered_set<spv::Op,_spvtools::opt::ConvertToHalfPass::hasher,_std::equal_to<spv::Op>,_std::allocator<spv::Op>_>
  ::unordered_set(&this->dref_image_ops_);
  std::
  unordered_set<spv::Op,_spvtools::opt::ConvertToHalfPass::hasher,_std::equal_to<spv::Op>,_std::allocator<spv::Op>_>
  ::unordered_set(&this->closure_ops_);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->relaxed_ids_set_);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->converted_ids_);
  return;
}

Assistant:

ConvertToHalfPass() : Pass() {}